

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

Oop __thiscall
Lodtalk::MethodSemanticAnalysis::visitIdentifierExpression
          (MethodSemanticAnalysis *this,IdentifierExpression *node)

{
  int iVar1;
  string *psVar2;
  anon_union_8_4_0eb573b0_for_Oop_0 symbol;
  VariableLookupPtr variable;
  shared_ptr<Lodtalk::TemporalVariableLookup> temporal;
  undefined1 local_40 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  symbol = (anon_union_8_4_0eb573b0_for_Oop_0)
           (this->super_ScopedInterpreter).currentScope.
           super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  AST::IdentifierExpression::getSymbol(node);
  EvaluationScope::lookSymbolRecursively((EvaluationScope *)local_40,(Oop)symbol);
  if ((element_type *)local_40._0_8_ != (element_type *)0x0) {
    iVar1 = (*(*(_func_int ***)local_40._0_8_)[2])();
    if ((char)iVar1 != '\0') {
      std::static_pointer_cast<Lodtalk::TemporalVariableLookup,Lodtalk::VariableLookup>
                ((shared_ptr<Lodtalk::VariableLookup> *)(local_40 + 0x10));
      if ((Node *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_40._16_8_ + 0x10))->
                  _vptr__Sp_counted_base != this->localContext) {
        *(undefined1 *)
         ((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_40._16_8_ + 0x10))->
                 _M_use_count + 1) = 1;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
    }
    AST::IdentifierExpression::setVariable(node,(VariableLookupPtr *)local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
    return (Oop)&NilObject;
  }
  psVar2 = AST::IdentifierExpression::getIdentifier_abi_cxx11_(node);
  AbstractASTVisitor::error
            ((AbstractASTVisitor *)node,(Node *)symbol.header,"undeclared identifier \'%s\'.",
             (psVar2->_M_dataplus)._M_p);
}

Assistant:

Oop MethodSemanticAnalysis::visitIdentifierExpression(IdentifierExpression *node)
{
    // Find the variable
    auto variable = currentScope->lookSymbolRecursively(node->getSymbol());
    if(!variable)
        error(node, "undeclared identifier '%s'.", node->getIdentifier().c_str());

    // Check the variable context, for marking the closure.
    if(variable->isTemporal())
    {
        auto temporal = std::static_pointer_cast<TemporalVariableLookup> (variable);
        if(temporal->getLocalContext() != localContext)
            temporal->setCapturedInClosure(true);
    }

    node->setVariable(variable);

    return Oop();
}